

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O1

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::CheckAllTypes(UpgradeMemoryModel *this,Instruction *inst)

{
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  bool bVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint in_ECX;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  pair<std::__detail::_Node_iterator<const_spvtools::opt::Instruction_*,_true,_false>,_bool> pVar11;
  Instruction *def;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  stack;
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  visited;
  Instruction *local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  void *local_98;
  void *pvStack_90;
  long local_88;
  Instruction *local_78;
  Instruction *local_70;
  undefined1 local_68 [40];
  size_t local_40;
  __node_base_ptr p_Stack_38;
  ulong uVar10;
  
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = (Instruction *)0x1;
  local_68._16_8_ = (Instruction *)0x0;
  local_68._24_8_ = 0;
  local_68._32_4_ = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_98 = (void *)0x0;
  pvStack_90 = (void *)0x0;
  local_88 = 0;
  local_70 = inst;
  std::vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>::
  _M_realloc_insert<spvtools::opt::Instruction_const*const&>
            ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
              *)&local_98,(iterator)0x0,&local_70);
  if (local_98 == pvStack_90) {
    uVar7 = 0;
  }
  else {
    uVar10 = 0;
    local_a0 = 0;
    local_9c = in_ECX;
    do {
      local_b0 = *(Instruction **)((long)pvStack_90 + -8);
      pvStack_90 = (void *)((long)pvStack_90 + -8);
      local_78 = (Instruction *)local_68;
      pVar11 = std::
               _Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::
               _M_insert<spvtools::opt::Instruction_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction_const*,false>>>>
                         ((_Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)local_68,&local_b0,&local_78);
      bVar3 = false;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (local_b0->opcode_ == OpTypeStruct) {
          bVar3 = HasDecoration(this,local_b0,0xffffffff,Coherent);
          bVar6 = (byte)local_a0 | bVar3;
          uVar7 = CONCAT31((int3)(local_a0 >> 8),bVar6);
          bVar3 = HasDecoration(this,local_b0,0xffffffff,Volatile);
          bVar9 = (byte)uVar10 | bVar3;
          uVar10 = CONCAT71((int7)(uVar10 >> 8),bVar9);
          local_a0 = uVar7;
          if ((bVar9 != 0 & bVar6) == 0) {
            uVar7 = (local_b0->has_result_id_ & 1) + 1;
            if (local_b0->has_type_id_ == false) {
              uVar7 = (uint)local_b0->has_result_id_;
            }
            if (uVar7 == (int)((ulong)((long)(local_b0->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_b0->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555) {
              bVar3 = false;
            }
            else {
              local_a4 = (uint)uVar10;
              uVar7 = 0;
              do {
                pIVar1 = (this->super_Pass).context_;
                if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                  IRContext::BuildDefUseManager(pIVar1);
                }
                pDVar2 = (pIVar1->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl;
                uVar8 = (local_b0->has_result_id_ & 1) + 1;
                if (local_b0->has_type_id_ == false) {
                  uVar8 = (uint)local_b0->has_result_id_;
                }
                uVar5 = Instruction::GetSingleWordOperand(local_b0,uVar8 + uVar7);
                local_78 = analysis::DefUseManager::GetDef(pDVar2,uVar5);
                std::
                vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                ::emplace_back<spvtools::opt::Instruction_const*>
                          ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                            *)&local_98,&local_78);
                uVar7 = uVar7 + 1;
                uVar8 = (local_b0->has_result_id_ & 1) + 1;
                if (local_b0->has_type_id_ == false) {
                  uVar8 = (uint)local_b0->has_result_id_;
                }
              } while (uVar7 < (int)((ulong)((long)(local_b0->operands_).
                                                                                                      
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(local_b0->operands_).
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                               -0x55555555 - uVar8);
LAB_001b2e48:
              bVar3 = false;
              uVar10 = (ulong)local_a4;
            }
          }
          else {
            local_9c = (uint)CONCAT11(bVar9,bVar6);
            bVar3 = true;
          }
        }
        else {
          iVar4 = spvOpcodeIsComposite(local_b0->opcode_);
          if (iVar4 == 0) {
            bVar3 = false;
            if (local_b0->opcode_ == OpTypePointer) {
              pIVar1 = (this->super_Pass).context_;
              local_a4 = (uint)uVar10;
              if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                IRContext::BuildDefUseManager(pIVar1);
              }
              pDVar2 = (pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl;
              uVar7 = (local_b0->has_result_id_ & 1) + 1;
              if (local_b0->has_type_id_ == false) {
                uVar7 = (uint)local_b0->has_result_id_;
              }
              uVar5 = Instruction::GetSingleWordOperand(local_b0,uVar7 + 1);
              local_78 = analysis::DefUseManager::GetDef(pDVar2,uVar5);
              std::
              vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
              ::emplace_back<spvtools::opt::Instruction_const*>
                        ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                          *)&local_98,&local_78);
              goto LAB_001b2e48;
            }
          }
          else {
            pIVar1 = (this->super_Pass).context_;
            if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar1);
            }
            pDVar2 = (pIVar1->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl;
            uVar5 = (local_b0->has_result_id_ & 1) + 1;
            if (local_b0->has_type_id_ == false) {
              uVar5 = (uint)local_b0->has_result_id_;
            }
            uVar5 = Instruction::GetSingleWordOperand(local_b0,uVar5);
            local_78 = analysis::DefUseManager::GetDef(pDVar2,uVar5);
            std::
            vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
            ::emplace_back<spvtools::opt::Instruction_const*>
                      ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                        *)&local_98,&local_78);
            bVar3 = false;
          }
        }
      }
      uVar7 = local_9c;
      if (bVar3) goto LAB_001b2e7b;
    } while (local_98 != pvStack_90);
    uVar7 = local_a0 & 0xff | ((uint)uVar10 & 0xff) << 8;
  }
LAB_001b2e7b:
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  std::
  _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  return SUB42(uVar7,0);
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::CheckAllTypes(
    const Instruction* inst) {
  std::unordered_set<const Instruction*> visited;
  std::vector<const Instruction*> stack;
  stack.push_back(inst);

  bool is_coherent = false;
  bool is_volatile = false;
  while (!stack.empty()) {
    const Instruction* def = stack.back();
    stack.pop_back();

    if (!visited.insert(def).second) continue;

    if (def->opcode() == spv::Op::OpTypeStruct) {
      // Any member decorated with coherent and/or volatile is enough to have
      // the related operation be flagged as coherent and/or volatile.
      is_coherent |= HasDecoration(def, std::numeric_limits<uint32_t>::max(),
                                   spv::Decoration::Coherent);
      is_volatile |= HasDecoration(def, std::numeric_limits<uint32_t>::max(),
                                   spv::Decoration::Volatile);
      if (is_coherent && is_volatile)
        return std::make_pair(is_coherent, is_volatile);

      // Check the subtypes.
      for (uint32_t i = 0; i < def->NumInOperands(); ++i) {
        stack.push_back(context()->get_def_use_mgr()->GetDef(
            def->GetSingleWordInOperand(i)));
      }
    } else if (spvOpcodeIsComposite(def->opcode())) {
      stack.push_back(context()->get_def_use_mgr()->GetDef(
          def->GetSingleWordInOperand(0u)));
    } else if (def->opcode() == spv::Op::OpTypePointer) {
      stack.push_back(context()->get_def_use_mgr()->GetDef(
          def->GetSingleWordInOperand(1u)));
    }
  }

  return std::make_pair(is_coherent, is_volatile);
}